

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void __thiscall APlayerPawn::ActivateMorphWeapon(APlayerPawn *this)

{
  player_t *ppVar1;
  PClass *p;
  PClassActor *type;
  DPSprite *pDVar2;
  AWeapon *pAVar3;
  FState *state;
  PClassActor *pPVar4;
  FName local_1c;
  
  local_1c.Index = (this->MorphWeapon).super_FName.Index;
  p = PClass::FindClass(&local_1c);
  type = dyn_cast<PClassActor>((DObject *)p);
  ppVar1 = (this->super_AActor).player;
  ppVar1->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  if (ppVar1->ReadyWeapon != (AWeapon *)0x0) {
    pDVar2 = player_t::GetPSprite(ppVar1,PSP_WEAPON);
    pDVar2->y = 32.0;
  }
  if (type == (PClassActor *)0x0) {
LAB_00469d5f:
    ((this->super_AActor).player)->ReadyWeapon = (AWeapon *)0x0;
  }
  else {
    pPVar4 = type;
    if (type != (PClassActor *)AWeapon::RegistrationInfo.MyClass) {
      do {
        pPVar4 = (PClassActor *)(pPVar4->super_PClass).ParentClass;
        if (pPVar4 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
      } while (pPVar4 != (PClassActor *)0x0);
      if (pPVar4 == (PClassActor *)0x0) goto LAB_00469d5f;
    }
    pAVar3 = (AWeapon *)
             AActor::FindInventory(&((this->super_AActor).player)->mo->super_AActor,type,false);
    ppVar1 = (this->super_AActor).player;
    ppVar1->ReadyWeapon = pAVar3;
    if (pAVar3 == (AWeapon *)0x0) {
      pAVar3 = (AWeapon *)AActor::GiveInventoryType(&ppVar1->mo->super_AActor,type);
      ((this->super_AActor).player)->ReadyWeapon = pAVar3;
      if (pAVar3 != (AWeapon *)0x0) {
        pAVar3->GivenAsMorphWeapon = true;
      }
    }
    ppVar1 = (this->super_AActor).player;
    pAVar3 = ppVar1->ReadyWeapon;
    if (pAVar3 != (AWeapon *)0x0) {
      state = AWeapon::GetReadyState(pAVar3);
      P_SetPsprite(ppVar1,PSP_WEAPON,state,false);
    }
  }
  ppVar1 = (this->super_AActor).player;
  if (ppVar1->ReadyWeapon != (AWeapon *)0x0) {
    P_SetPsprite(ppVar1,PSP_FLASH,(FState *)0x0,false);
  }
  ((this->super_AActor).player)->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  return;
}

Assistant:

void APlayerPawn::ActivateMorphWeapon ()
{
	PClassActor *morphweapon = PClass::FindActor (MorphWeapon);
	player->PendingWeapon = WP_NOCHANGE;

	if (player->ReadyWeapon != nullptr)
	{
		player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
	}

	if (morphweapon == nullptr || !morphweapon->IsDescendantOf (RUNTIME_CLASS(AWeapon)))
	{ // No weapon at all while morphed!
		player->ReadyWeapon = nullptr;
	}
	else
	{
		player->ReadyWeapon = static_cast<AWeapon *>(player->mo->FindInventory (morphweapon));
		if (player->ReadyWeapon == nullptr)
		{
			player->ReadyWeapon = static_cast<AWeapon *>(player->mo->GiveInventoryType (morphweapon));
			if (player->ReadyWeapon != nullptr)
			{
				player->ReadyWeapon->GivenAsMorphWeapon = true; // flag is used only by new beastweap semantics in P_UndoPlayerMorph
			}
		}
		if (player->ReadyWeapon != nullptr)
		{
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
	}

	if (player->ReadyWeapon != nullptr)
	{
		P_SetPsprite(player, PSP_FLASH, nullptr);
	}

	player->PendingWeapon = WP_NOCHANGE;
}